

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

void __thiscall
Js::SourceTextModuleRecord::DecrementAndEvaluateIfNothingAwaited(SourceTextModuleRecord *this)

{
  bool bVar1;
  Var errorObject;
  JavascriptException *err;
  JavascriptExceptionObject *exception;
  SourceTextModuleRecord *this_local;
  
  bVar1 = DecrementAwaited(this);
  if (bVar1) {
    FinishModuleEvaluation(this,false);
  }
  return;
}

Assistant:

void SourceTextModuleRecord::DecrementAndEvaluateIfNothingAwaited()
    {
        if (DecrementAwaited())
        {
            JavascriptExceptionObject *exception = nullptr;
            try
            {
                FinishModuleEvaluation(false);
            }
            catch (const Js::JavascriptException &err)
            {
                if (!WasEvaluated())
                {
                    SetWasEvaluated();
                }
                SetEvaluating(false);
                exception = err.GetAndClear();
                Var errorObject = exception->GetThrownObject(scriptContext);
                AssertOrFailFastMsg(errorObject != nullptr, "ModuleEvaluation: null error object thrown from root function");

                PropogateRejection(errorObject);
                return;
            }
        }
    }